

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O1

void __thiscall
de::Random::choose<char_const*,char*>(Random *this,char *first,char *last,char *result,int numItems)

{
  long lVar1;
  deUint32 dVar2;
  uint uVar3;
  long lVar4;
  
  if (first != last) {
    lVar4 = 0;
    do {
      uVar3 = (uint)lVar4;
      if ((int)uVar3 < numItems) {
LAB_00fedf10:
        result[(int)uVar3] = first[lVar4];
      }
      else {
        dVar2 = deRandom_getUint32(&this->m_rnd);
        uVar3 = dVar2 % (uVar3 + 1);
        if ((int)uVar3 < numItems) goto LAB_00fedf10;
      }
      lVar1 = lVar4 + 1;
      lVar4 = lVar4 + 1;
    } while (first + lVar1 != last);
  }
  return;
}

Assistant:

void Random::choose (InputIter first, InputIter last, OutputIter result, int numItems)
{
	// Algorithm: Reservoir sampling
	// http://en.wikipedia.org/wiki/Reservoir_sampling
	// \note Will not work for suffling an array. Use suffle() instead.

	int ndx;
	for (ndx = 0; first != last; ++first, ++ndx)
	{
		if (ndx < numItems)
			*(result + ndx) = *first;
		else
		{
			int r = getInt(0, ndx);
			if (r < numItems)
				*(result + r) = *first;
		}
	}

	DE_ASSERT(ndx >= numItems);
}